

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

QMatchData * __thiscall
QMap<QString,_QMatchData>::operator[](QMap<QString,_QMatchData> *this,QString *key)

{
  QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QString,_QMatchData>_>,_bool> pVar3;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
  local_b0;
  QMatchData local_a8;
  pair<const_QString,_QMatchData> local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_b0.d.ptr ==
       (QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
           *)local_b0.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_b0.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_*>
          )(QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
       *)local_b0.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>
                        *)local_b0.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<QString,_std::pair<const_QString,_QMatchData>,_std::_Select1st<std::pair<const_QString,_QMatchData>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    local_a8.indices.v = false;
    local_a8.indices.vector.d.d = (Data *)0x0;
    local_a8.indices.vector.d.ptr._0_4_ = 0;
    local_a8.indices.vector.d.ptr._4_4_ = 0;
    local_a8.indices.vector.d.size._0_4_ = 0;
    local_a8.indices._28_8_ = 0;
    local_a8.indices.t = -1;
    local_a8.exactMatchIndex = -1;
    local_a8.partial = false;
    std::pair<const_QString,_QMatchData>::pair<QMatchData,_true>(&local_78,key,&local_a8);
    pVar3 = std::
            _Rb_tree<QString,std::pair<QString_const,QMatchData>,std::_Select1st<std::pair<QString_const,QMatchData>>,std::less<QString>,std::allocator<std::pair<QString_const,QMatchData>>>
            ::_M_insert_unique<std::pair<QString_const,QMatchData>>
                      ((_Rb_tree<QString,std::pair<QString_const,QMatchData>,std::_Select1st<std::pair<QString_const,QMatchData>>,std::less<QString>,std::allocator<std::pair<QString_const,QMatchData>>>
                        *)&pQVar1->m,&local_78);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::pair<const_QString,_QMatchData>::~pair(&local_78);
    QArrayDataPointer<int>::~QArrayDataPointer(&local_a8.indices.vector.d);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QMatchData,_std::less<QString>,_std::allocator<std::pair<const_QString,_QMatchData>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QMatchData *)&iVar2._M_node[1]._M_right;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }